

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor-xor-rle-per-draw-list-with-vtx-offset.cpp
# Opt level: O1

bool __thiscall
ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::setDrawData
          (XorRlePerDrawListWithVtxOffset *this,ImDrawData *drawData)

{
  DrawLists *__x;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> bVar1;
  pointer pcVar2;
  ImDrawList *pIVar3;
  ImDrawVert *pIVar4;
  unsigned_short *__first;
  ImDrawCmd *pIVar5;
  pointer pvVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> bVar10;
  ulong uVar11;
  XorRlePerDrawListWithVtxOffset *pXVar12;
  long lVar13;
  pointer pvVar14;
  uint uVar15;
  ImDrawData *this_00;
  uint32_t nCmd;
  uint32_t c;
  float offsetX;
  float offsetY;
  uint32_t nVertices;
  uint32_t offsetVtx;
  uint32_t textureId;
  uint32_t nElements;
  undefined4 local_8c;
  float local_88;
  float local_84;
  float local_80;
  uint local_7c;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> local_78;
  ulong local_70;
  uint local_68;
  uint local_64;
  undefined4 local_60;
  uint local_5c;
  ImDrawData *local_58;
  ulong local_50;
  XorRlePerDrawListWithVtxOffset *local_48;
  DrawLists *local_40;
  DrawLists *local_38;
  
  __x = &(this->super_Interface).m_drawListsCur;
  local_38 = &(this->super_Interface).m_drawListsPrev;
  local_48 = this;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::operator=(local_38,__x);
  uVar8 = (ulong)(uint)drawData->CmdListsCount;
  local_58 = drawData;
  local_40 = __x;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize(__x,uVar8);
  local_50 = uVar8;
  if (uVar8 != 0) {
    uVar8 = 0;
    do {
      bVar1.container =
           (local_40->
           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + uVar8;
      pcVar2 = ((bVar1.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (((bVar1.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
          super__Vector_impl_data._M_finish != pcVar2) {
        ((bVar1.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_finish = pcVar2;
      }
      pIVar3 = local_58->CmdLists[uVar8];
      pIVar4 = (pIVar3->VtxBuffer).Data;
      local_84 = (pIVar4->pos).x;
      local_80 = (pIVar4->pos).y;
      local_70 = uVar8;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_84,(char *)&local_80,bVar1);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_80,(char *)&local_7c,bVar1);
      local_7c = (pIVar3->VtxBuffer).Size;
      if ((ulong)local_7c != 0) {
        pIVar4 = (pIVar3->VtxBuffer).Data;
        lVar7 = 0;
        do {
          *(float *)((long)&(pIVar4->pos).x + lVar7) =
               *(float *)((long)&(pIVar4->pos).x + lVar7) - local_84;
          *(float *)((long)&(pIVar4->pos).y + lVar7) =
               *(float *)((long)&(pIVar4->pos).y + lVar7) - local_80;
          lVar7 = lVar7 + 0x14;
        } while ((ulong)local_7c * 0x14 != lVar7);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_7c,(char *)&local_78,bVar1);
      pIVar4 = (pIVar3->VtxBuffer).Data;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)pIVar4,(char *)(pIVar4 + local_7c),bVar1);
      if ((ulong)local_7c != 0) {
        pIVar4 = (pIVar3->VtxBuffer).Data;
        lVar7 = 0;
        do {
          *(float *)((long)&(pIVar4->pos).x + lVar7) =
               local_84 + *(float *)((long)&(pIVar4->pos).x + lVar7);
          *(float *)((long)&(pIVar4->pos).y + lVar7) =
               local_80 + *(float *)((long)&(pIVar4->pos).y + lVar7);
          lVar7 = lVar7 + 0x14;
        } while ((ulong)local_7c * 0x14 != lVar7);
      }
      uVar15 = (pIVar3->IdxBuffer).Size;
      local_88 = (float)((uVar15 & 1) + uVar15);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_88,(char *)&local_84,bVar1);
      __first = (pIVar3->IdxBuffer).Data;
      local_78.container = (vector<char,_std::allocator<char>_> *)pIVar3;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)__first,(char *)(__first + uVar15),bVar1);
      if ((uVar15 & 1) != 0) {
        local_8c = local_8c & 0xffff0000;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  ((char *)&local_8c,(char *)((long)&local_8c + 2),bVar1);
      }
      bVar10.container = local_78.container;
      local_8c = *(uint *)&((local_78.container)->super__Vector_base<char,_std::allocator<char>_>).
                           _M_impl.super__Vector_impl_data._M_start;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_8c,(char *)&local_88,bVar1);
      if (local_8c != 0) {
        uVar15 = 0;
        do {
          pIVar5 = (((ImDrawList *)bVar10.container)->CmdBuffer).Data;
          local_5c = pIVar5[(int)uVar15].ElemCount;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&local_5c,(char *)&local_58,bVar1);
          local_60 = *(undefined4 *)&pIVar5[(int)uVar15].TextureId;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&local_60,(char *)&local_5c,bVar1);
          local_64 = pIVar5[(int)uVar15].VtxOffset;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&local_64,(char *)&local_60,bVar1);
          local_68 = pIVar5[(int)uVar15].IdxOffset;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&local_68,(char *)&local_64,bVar1);
          bVar10.container = local_78.container;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)(pIVar5 + (int)uVar15),(char *)&pIVar5[(int)uVar15].TextureId,bVar1);
          uVar15 = uVar15 + 1;
        } while (uVar15 < local_8c);
      }
      uVar8 = local_70 + 1;
    } while (uVar8 != local_50);
  }
  pXVar12 = local_48;
  this_00 = (ImDrawData *)&(local_48->super_Interface).m_drawListsDiff;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     *)this_00,
                    (local_48->super_Interface).m_drawListsDiff.
                    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  uVar8 = local_50;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            *)this_00,local_50);
  if (uVar8 != 0) {
    local_70 = 0;
    local_58 = this_00;
    do {
      pvVar14 = (local_40->
                super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + local_70;
      pvVar6 = (((_Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  *)&this_00->Valid)->_M_impl).super__Vector_impl_data._M_start;
      local_78.container = pvVar6 + local_70;
      pcVar2 = pvVar6[local_70].super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar6[local_70].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data + 8) != pcVar2) {
        ((local_78.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_finish = pcVar2;
      }
      local_84 = 1.4013e-45;
      pvVar6 = (pXVar12->super_Interface).m_drawListsPrev.
               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(pXVar12->super_Interface).m_drawListsPrev.
                     super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
              -0x5555555555555555;
      if ((uVar8 < local_70 || uVar8 - local_70 == 0) ||
         ((long)*(pointer *)
                 ((long)&pvVar6[local_70].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data + 8) -
          *(long *)&pvVar6[local_70].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data !=
          (long)*(pointer *)
                 ((long)&(pvVar14->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data + 8) -
          *(long *)&(pvVar14->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data)) {
        local_84 = 0.0;
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_84,(char *)&local_80,local_78);
      if (local_84 == 1.4013e-45) {
        pvVar6 = (local_38->
                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + local_70;
        fVar9 = 0.0;
        local_80 = 0.0;
        local_7c = 0;
        local_88 = 0.0;
        local_8c = 0;
        lVar7 = *(long *)&(pvVar14->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data;
        uVar8 = (long)*(pointer *)
                       ((long)&(pvVar14->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data + 8) - lVar7;
        if ((int)uVar8 < 1) {
          uVar15 = 0;
        }
        else {
          lVar13 = 0;
          do {
            bVar1.container = local_78.container;
            uVar15 = *(uint *)(lVar7 + lVar13);
            fVar9 = (float)(*(uint *)(*(long *)&(pvVar6->
                                                super__Vector_base<char,_std::allocator<char>_>).
                                                _M_impl.super__Vector_impl_data + lVar13) ^ uVar15);
            if (fVar9 == local_88) {
              local_8c = local_8c + 1;
            }
            else {
              if (local_8c != 0) {
                std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                          ((char *)&local_8c,(char *)&local_88,local_78);
                std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                          ((char *)&local_88,(char *)&local_84,bVar1);
              }
              local_8c = 1;
              local_88 = fVar9;
            }
            lVar13 = lVar13 + 4;
            lVar7 = *(long *)&(pvVar14->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data;
            uVar8 = (long)*(pointer *)
                           ((long)&(pvVar14->super__Vector_base<char,_std::allocator<char>_>).
                                   _M_impl.super__Vector_impl_data + 8) - lVar7;
          } while ((int)lVar13 < (int)uVar8);
        }
        local_80 = fVar9;
        local_7c = uVar15;
        if ((uVar8 & 3) != 0) {
          local_80 = 0.0;
          local_7c = 0;
          uVar11 = (ulong)((uint)uVar8 & 0xfffffffc);
          uVar8 = (ulong)((uint)uVar8 & 3);
          memcpy(&local_80,
                 (void *)(*(long *)&(pvVar6->super__Vector_base<char,_std::allocator<char>_>).
                                    _M_impl.super__Vector_impl_data + uVar11),uVar8);
          memcpy(&local_7c,(void *)(lVar7 + uVar11),uVar8);
          bVar1.container = local_78.container;
          fVar9 = (float)(local_7c ^ (uint)local_80);
          local_80 = fVar9;
          if (fVar9 == local_88) {
            local_8c = local_8c + 1;
          }
          else {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      ((char *)&local_8c,(char *)&local_88,local_78);
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      ((char *)&local_88,(char *)&local_84,bVar1);
            local_8c = 1;
            local_88 = fVar9;
          }
        }
        bVar1.container = local_78.container;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  ((char *)&local_8c,(char *)&local_88,local_78);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  ((char *)&local_88,(char *)&local_84,bVar1);
        pXVar12 = local_48;
        this_00 = local_58;
      }
      else if (local_84 == 0.0) {
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  ((pvVar14->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&(pvVar14->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                            super__Vector_impl_data + 8),local_78);
      }
      local_70 = local_70 + 1;
    } while (local_70 != local_50);
  }
  return true;
}

Assistant:

bool XorRlePerDrawListWithVtxOffset::setDrawData(const ::ImDrawData * drawData) {
    m_drawListsPrev = m_drawListsCur;

    uint32_t nCmdLists = drawData->CmdListsCount;
    m_drawListsCur.resize(nCmdLists);

    for (uint32_t iList = 0; iList < nCmdLists; iList++) {
        m_drawListsCur[iList].clear();
        ::writeCmdListToBuffer(drawData->CmdLists[iList], m_drawListsCur[iList]);
    }

    // calculate diff

    m_drawListsDiff.clear();
    m_drawListsDiff.resize(nCmdLists);

    for (uint32_t iList = 0; iList < nCmdLists; ++iList) {
        auto & bufferCur = m_drawListsCur[iList];
        auto & bufferDiff = m_drawListsDiff[iList];

        bufferDiff.clear();

        int32_t type = 1; // Run-Length Encoding
        if (iList >= m_drawListsPrev.size() || m_drawListsPrev[iList].size() != bufferCur.size()) {
            type = 0; // Full update
        }

        std::copy((char *)(&type), (char *)(&type) + sizeof(type), std::back_inserter(bufferDiff));

        if (type == 0) {
            std::copy(bufferCur.begin(), bufferCur.end(), std::back_inserter(bufferDiff));
        } else if (type == 1) {
            auto & bufferPrev = m_drawListsPrev[iList];

            uint32_t a = 0;
            uint32_t b = 0;
            uint32_t c = 0;
            uint32_t n = 0;

            for (int i = 0; i < (int) bufferCur.size(); i += 4) {
                std::memcpy((char *)(&a), bufferPrev.data() + i, sizeof(uint32_t));
                std::memcpy((char *)(&b), bufferCur.data() + i, sizeof(uint32_t));
                a = a ^ b;
                if (a == c) {
                    ++n;
                } else {
                    if (n > 0) {
                        std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                        std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    }
                    n = 1;
                    c = a;
                }
            }

            if (bufferCur.size() % 4 != 0) {
                a = 0;
                b = 0;
                uint32_t i = (bufferCur.size()/4)*4;
                uint32_t k = bufferCur.size() - i;
                std::memcpy((char *)(&a), bufferPrev.data() + i, k);
                std::memcpy((char *)(&b), bufferCur.data() + i, k);
                a = a ^ b;
                if (a == c) {
                    ++n;
                } else {
                    std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    n = 1;
                    c = a;
                }
            }

            std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
            std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
        }
    }

    return true;
}